

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_load.cpp
# Opt level: O3

unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true> __thiscall
duckdb::Transformer::TransformLoad(Transformer *this,PGLoadStmt *stmt)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> _Var5;
  Transformer *this_00;
  size_t sVar6;
  pointer pLVar7;
  pointer pLVar8;
  LoadType LVar9;
  long in_RDX;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = (Transformer *)operator_new(0x80);
  LoadStatement::LoadStatement((LoadStatement *)this_00);
  (this->parent).ptr = this_00;
  local_50._M_head_impl = (LoadInfo *)operator_new(0x80);
  ((local_50._M_head_impl)->super_ParseInfo).info_type = LOAD_INFO;
  ((local_50._M_head_impl)->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__LoadInfo_0246a058
  ;
  ((local_50._M_head_impl)->filename)._M_dataplus._M_p =
       (pointer)&((local_50._M_head_impl)->filename).field_2;
  ((local_50._M_head_impl)->filename)._M_string_length = 0;
  ((local_50._M_head_impl)->filename).field_2._M_local_buf[0] = '\0';
  ((local_50._M_head_impl)->repository)._M_dataplus._M_p =
       (pointer)&((local_50._M_head_impl)->repository).field_2;
  ((local_50._M_head_impl)->repository)._M_string_length = 0;
  ((local_50._M_head_impl)->repository).field_2._M_local_buf[0] = '\0';
  ((local_50._M_head_impl)->version)._M_dataplus._M_p =
       (pointer)&((local_50._M_head_impl)->version).field_2;
  ((local_50._M_head_impl)->version)._M_string_length = 0;
  ((local_50._M_head_impl)->version).field_2._M_local_buf[0] = '\0';
  pcVar3 = *(char **)(in_RDX + 8);
  local_48[0] = local_38;
  if (pcVar3 == (char *)0x0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,anon_var_dwarf_4ed193b + 9)
    ;
  }
  else {
    sVar6 = strlen(pcVar3);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar3,pcVar3 + sVar6);
  }
  pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar7->filename,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  pcVar3 = *(char **)(in_RDX + 0x10);
  if (pcVar3 == (char *)0x0) {
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,anon_var_dwarf_4ed193b + 9)
    ;
  }
  else {
    local_48[0] = local_38;
    sVar6 = strlen(pcVar3);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar3,pcVar3 + sVar6);
  }
  pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar7->repository,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  bVar1 = *(bool *)(in_RDX + 0x18);
  pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  pLVar7->repo_is_alias = bVar1;
  pcVar3 = *(char **)(in_RDX + 0x20);
  if (pcVar3 == (char *)0x0) {
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,anon_var_dwarf_4ed193b + 9)
    ;
  }
  else {
    local_48[0] = local_38;
    sVar6 = strlen(pcVar3);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar3,pcVar3 + sVar6);
  }
  pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar7->version,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  iVar2 = *(int *)(in_RDX + 0x28);
  if (iVar2 == 0) {
    pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar9 = LOAD;
  }
  else if (iVar2 == 1) {
    pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar9 = INSTALL;
  }
  else {
    if (iVar2 != 2) goto LAB_00e8a369;
    pLVar7 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar9 = FORCE_INSTALL;
  }
  pLVar7->load_type = LVar9;
LAB_00e8a369:
  pLVar8 = unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true>::
           operator->((unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true>
                       *)this);
  _Var5._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (LoadInfo *)0x0;
  _Var4._M_head_impl =
       (pLVar8->info).super_unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::LoadInfo_*,_std::default_delete<duckdb::LoadInfo>_>.
       super__Head_base<0UL,_duckdb::LoadInfo_*,_false>._M_head_impl;
  (pLVar8->info).super_unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LoadInfo_*,_std::default_delete<duckdb::LoadInfo>_>.
  super__Head_base<0UL,_duckdb::LoadInfo_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var4._M_head_impl != (LoadInfo *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
    if (local_50._M_head_impl != (LoadInfo *)0x0) {
      (*((local_50._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>_>)
         (unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>_>)this;
}

Assistant:

unique_ptr<LoadStatement> Transformer::TransformLoad(duckdb_libpgquery::PGLoadStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGLoadStmt);

	auto load_stmt = make_uniq<LoadStatement>();
	auto load_info = make_uniq<LoadInfo>();
	load_info->filename = stmt.filename ? string(stmt.filename) : "";
	load_info->repository = stmt.repository ? string(stmt.repository) : "";
	load_info->repo_is_alias = stmt.repo_is_alias;
	load_info->version = stmt.version ? string(stmt.version) : "";
	switch (stmt.load_type) {
	case duckdb_libpgquery::PG_LOAD_TYPE_LOAD:
		load_info->load_type = LoadType::LOAD;
		break;
	case duckdb_libpgquery::PG_LOAD_TYPE_INSTALL:
		load_info->load_type = LoadType::INSTALL;
		break;
	case duckdb_libpgquery::PG_LOAD_TYPE_FORCE_INSTALL:
		load_info->load_type = LoadType::FORCE_INSTALL;
		break;
	}
	load_stmt->info = std::move(load_info);
	return load_stmt;
}